

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

void bio_hdrarg_free(char **argname,char **argval)

{
  char *ptr;
  long lVar1;
  
  if (argname != (char **)0x0) {
    ptr = *argname;
    if (ptr != (char *)0x0) {
      lVar1 = 0;
      do {
        ckd_free(ptr);
        ckd_free(*(void **)((long)argval + lVar1));
        ptr = *(char **)((long)argname + lVar1 + 8);
        lVar1 = lVar1 + 8;
      } while (ptr != (char *)0x0);
    }
    ckd_free(argname);
    ckd_free(argval);
    return;
  }
  return;
}

Assistant:

void
bio_hdrarg_free(char **argname, char **argval)
{
    int32 i;

    if (argname == NULL)
        return;
    for (i = 0; argname[i]; i++) {
        ckd_free(argname[i]);
        ckd_free(argval[i]);
    }
    ckd_free(argname);
    ckd_free(argval);
}